

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivSetColors(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int nNodes [2];
  
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x410,"int Gia_ManEquivSetColors(Gia_Man_t *, int)");
  }
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x40000000);
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x80000000);
  iVar3 = 0;
  while( true ) {
    iVar1 = p->nRegs;
    nNodes[1] = p->vCis->nSize - iVar1;
    if (nNodes[1] <= iVar3) break;
    pGVar2 = Gia_ManCi(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      iVar1 = p->nRegs;
      nNodes[1] = p->vCis->nSize - iVar1;
      break;
    }
    iVar1 = Gia_ObjId(p,pGVar2);
    p->pReprs[iVar1] = (Gia_Rpr_t)((uint)p->pReprs[iVar1] | 0x40000000);
    p->pReprs[iVar1] = (Gia_Rpr_t)((uint)p->pReprs[iVar1] | 0x80000000);
    iVar3 = iVar3 + 1;
  }
  nNodes[0] = nNodes[1];
  for (uVar4 = 0; (int)uVar4 < p->vCos->nSize - iVar1; uVar4 = uVar4 + 1) {
    pGVar2 = Gia_ManCo(p,uVar4);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ManEquivSetColor_rec
                      (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),uVar4 & 1);
    nNodes[uVar4 & 1] = nNodes[uVar4 & 1] + iVar3;
    iVar1 = p->nRegs;
  }
  uVar4 = Gia_ManCandNum(p);
  uVar5 = uVar4 - nNodes[0];
  uVar6 = uVar4 - nNodes[1];
  if (fVerbose != 0) {
    Abc_Print(1,"CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",(ulong)uVar4,
              (ulong)nNodes & 0xffffffff,(ulong)(uint)nNodes[1],(ulong)uVar5,(ulong)uVar6,
              (ulong)(nNodes[0] - uVar6));
  }
  return (int)(uVar6 + uVar5) / 2;
}

Assistant:

int Gia_ManEquivSetColors( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, nNodes[2], nDiffs[2];
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ObjSetColors( p, 0 );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetColors( p, Gia_ObjId(p,pObj) );
    nNodes[0] = nNodes[1] = Gia_ManPiNum(p);
    Gia_ManForEachPo( p, pObj, i )
        nNodes[i&1] += Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), i&1 );
//    Gia_ManForEachObj( p, pObj, i )
//        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
//            assert( Gia_ObjColors(p, i) );
    nDiffs[0] = Gia_ManCandNum(p) - nNodes[0];
    nDiffs[1] = Gia_ManCandNum(p) - nNodes[1];
    if ( fVerbose )
    {
        Abc_Print( 1, "CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",
            Gia_ManCandNum(p), nNodes[0], nNodes[1], nDiffs[0], nDiffs[1],
            Gia_ManCandNum(p) - nDiffs[0] - nDiffs[1] );
    }
    return (nDiffs[0] + nDiffs[1]) / 2;
}